

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O0

bool __thiscall llvm::Triple::hasEnvironment(Triple *this)

{
  bool local_f9;
  char *local_e8 [2];
  StringRef local_d8;
  Triple *local_c8;
  Triple *this_local;
  char **local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  size_t local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_c8 = this;
  local_d8 = getEnvironmentName(this);
  local_b8 = local_e8;
  this_local = (Triple *)0x2df48a;
  local_e8[0] = "";
  local_a8 = strlen("");
  local_80 = local_d8.Data;
  local_78 = local_d8.Length;
  local_90 = local_e8[0];
  local_a0 = local_d8.Data;
  local_98 = local_d8.Length;
  local_b0 = local_e8[0];
  local_50 = local_d8.Data;
  local_48 = local_d8.Length;
  local_60 = local_e8[0];
  local_70 = local_e8[0];
  local_38 = local_e8[0];
  local_40 = &local_50;
  local_f9 = false;
  if (local_d8.Length == local_a8) {
    local_18 = local_d8.Data;
    local_20 = local_e8[0];
    if (local_a8 == 0) {
      local_c = 0;
    }
    else {
      local_88 = local_a8;
      local_68 = local_a8;
      local_58 = local_a8;
      local_30 = local_a8;
      local_28 = local_a8;
      local_c = memcmp(local_d8.Data,local_e8[0],local_a8);
    }
    local_f9 = local_c == 0;
  }
  return (bool)((local_f9 ^ 0xffU) & 1);
}

Assistant:

bool hasEnvironment() const {
    return getEnvironmentName() != "";
  }